

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

int Hex::Hexdumper<unsigned_char>::count_identical_lines(uchar *first,uchar *last,int unitsperline)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uchar *puVar4;
  uchar *puVar5;
  pair<const_unsigned_char_*,_const_unsigned_char_*> thisline;
  pair<const_unsigned_char_*,_const_unsigned_char_*> firstline;
  pair<const_unsigned_char_*,_const_unsigned_char_*> local_50;
  pair<const_unsigned_char_*,_const_unsigned_char_*> local_40;
  
  lVar3 = (long)unitsperline;
  puVar4 = first + lVar3;
  iVar2 = 1;
  if (puVar4 < last) {
    puVar5 = first + lVar3 * 2;
    local_40.first = first;
    local_40.second = puVar4;
    do {
      local_50.second = last;
      if (puVar5 < last) {
        local_50.second = puVar5;
      }
      local_50.first = puVar4;
      bVar1 = data_is_equal<std::pair<unsigned_char_const*,unsigned_char_const*>>
                        (&local_40,&local_50);
      if (!bVar1) {
        return iVar2;
      }
      puVar4 = puVar4 + lVar3;
      iVar2 = iVar2 + 1;
      puVar5 = puVar5 + lVar3;
    } while (puVar4 < last);
  }
  return iVar2;
}

Assistant:

static int count_identical_lines(const T*first, const T*last, int unitsperline)
    {
        auto p = first;
        auto pend = std::min(last, p+unitsperline);
        auto firstline = std::make_pair(p, pend);

        int count = 1;

        p = pend;
        while (p<last) {
            auto pend = std::min(last, p+unitsperline);
            auto thisline = std::make_pair(p, pend);

            if (!data_is_equal(firstline, thisline))
                break;

            count++;

            p = pend;
        }

        return count;
    }